

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp_uint_t sexp_bignum_fxdiv(sexp ctx,sexp a,sexp_uint_t b,int offset)

{
  long lVar1;
  sexp_uint_t sVar2;
  long lVar3;
  sexp_uint_t sVar4;
  int iVar5;
  
  sVar4 = (a->value).string.offset;
  do {
    sVar2 = sVar4;
    if (sVar2 == 1) {
      iVar5 = 1;
      goto LAB_00119175;
    }
    sVar4 = sVar2 - 1;
  } while (*(long *)((long)&a->value + sVar2 * 8 + 8) == 0);
  iVar5 = (int)sVar2;
LAB_00119175:
  sVar4 = 0;
  while (iVar5 = iVar5 + -1, offset <= iVar5) {
    lVar1 = *(long *)((long)&a->value + (long)iVar5 * 8 + 0x10);
    lVar3 = __udivti3(lVar1,sVar4,b,0);
    *(long *)((long)&a->value + (long)iVar5 * 8 + 0x10) = lVar3;
    sVar4 = lVar1 - lVar3 * b;
  }
  return sVar4;
}

Assistant:

sexp_uint_t sexp_bignum_fxdiv (sexp ctx, sexp a, sexp_uint_t b, int offset) {
  sexp_uint_t len=sexp_bignum_hi(a), *data=sexp_bignum_data(a), q, r=0;
  int i;
  sexp_luint_t n = luint_from_uint(0);
  for (i=len-1; i>=offset; i--) {
    n = luint_add(luint_shl(n,  sizeof(sexp_uint_t)*8), luint_from_uint(data[i]));
    q = luint_to_uint(luint_div_uint(n, b));
    r = luint_to_uint(luint_sub(n, luint_mul_uint(luint_from_uint(q),  b)));
    data[i] = q;
    n = luint_from_uint(r);
  }
  return r;
}